

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O1

void map_destroy(map m)

{
  void *__ptr;
  long lVar1;
  ulong uVar2;
  
  if (m != (map)0x0) {
    if (m->buckets != (bucket)0x0) {
      if (m->capacity != 0) {
        lVar1 = 0x10;
        uVar2 = 0;
        do {
          __ptr = *(void **)((long)&m->buckets->count + lVar1);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          uVar2 = uVar2 + 1;
          lVar1 = lVar1 + 0x18;
        } while (uVar2 < m->capacity);
      }
      free(m->buckets);
    }
    free(m);
    return;
  }
  return;
}

Assistant:

void map_destroy(map m)
{
	if (m == NULL)
	{
		return;
	}

	if (m->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);
	}

	free(m);
}